

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O3

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
bf_crc::convert_uint8_to_bitset
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          uint8_t *array,size_t size)

{
  pointer puVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long uVar7;
  uint uVar8;
  uint uVar9;
  allocator<unsigned_long> local_29;
  
  uVar4 = 0;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (__return_storage_ptr__,size * 8,0,&local_29);
  if (size != 0) {
    puVar1 = (__return_storage_ptr__->m_bits).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = 0;
    do {
      uVar8 = (uint)uVar4;
      uVar9 = uVar8 & 0x3f;
      lVar3 = 8;
      do {
        uVar6 = 1L << ((byte)uVar9 & 0x3f);
        uVar5 = uVar4 >> 6;
        if ((array[uVar2] >> ((int)lVar3 - 1U & 0x1f) & 1) == 0) {
          uVar7 = ~uVar6 & puVar1[uVar5];
        }
        else {
          uVar7 = uVar6 | puVar1[uVar5];
        }
        puVar1[uVar5] = uVar7;
        uVar4 = uVar4 + 1;
        uVar9 = uVar9 + 1;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
      uVar2 = (ulong)((int)uVar2 + 1);
      uVar4 = (ulong)(uVar8 + 8);
    } while (uVar2 < size);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::dynamic_bitset<> bf_crc::convert_uint8_to_bitset(const uint8_t array[], size_t size) {

	boost::dynamic_bitset<> retVal(size*8);

	for (unsigned int i = 0; i < size; i++)
		for (int j = 0; j < 8; j++)
			retVal[i*8+j] = (array[i] >> (7-j)) & 0x1 ? true : false;

	return retVal;
}